

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall ON_SimpleArray<int>::Reverse(ON_SimpleArray<int> *this)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)this->m_count;
  piVar2 = this->m_a;
  for (lVar4 = 0; lVar3 = lVar3 + -1, lVar4 < lVar3; lVar4 = lVar4 + 1) {
    iVar1 = piVar2[lVar4];
    piVar2[lVar4] = piVar2[lVar3];
    piVar2[lVar3] = iVar1;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Reverse()
{
  // NOTE:
  // If anything in "T" depends on the value of this's address,
  // then don't call Reverse().
  T t;
  int i = 0;  
  int j = m_count-1;
  for ( /*empty*/; i < j; i++, j-- ) {
    t = m_a[i];
    m_a[i] = m_a[j];
    m_a[j] = t;
  }
}